

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O2

CURLcode ftp_statemachine(Curl_easy *data,connectdata *conn)

{
  anon_union_240_12_f950f0f9_for_proto *paVar1;
  int *piVar2;
  undefined1 *puVar3;
  char cVar4;
  ftpstate instate;
  curl_usessl cVar5;
  curl_TimeCond cVar6;
  FTP *pFVar7;
  FILEPROTO *pFVar8;
  ulong uVar9;
  Curl_addrinfo *hostname;
  undefined8 uVar10;
  byte bVar11;
  CURLcode CVar12;
  int iVar13;
  resolve_t rVar14;
  byte *pbVar15;
  size_t len;
  time_t tVar16;
  long lVar17;
  char *pcVar18;
  char *pcVar19;
  char (*pacVar20) [4];
  ulong uVar21;
  long lVar22;
  ftpport fcmd;
  curl_off_t cVar23;
  char *pcVar24;
  size_t *size_00;
  connectdata *pcVar25;
  byte *pbVar26;
  uint uVar27;
  connectdata *conn_1;
  byte *pbVar28;
  bool bVar29;
  undefined4 uVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  int year;
  undefined1 auStack_19c [4];
  connectdata *local_198;
  size_t nread;
  int ftpcode;
  int second;
  int minute;
  int hour;
  int day;
  int month;
  curl_off_t filesize;
  uint local_168;
  uint local_164;
  int local_160;
  int local_15c;
  int local_158;
  curl_off_t size;
  undefined8 uStack_130;
  undefined8 local_128;
  
  nread = 0;
  paVar1 = &conn->proto;
  if ((conn->proto).ftpc.pp.sendleft != 0) {
    CVar12 = Curl_pp_flushsend(data,&(paVar1->ftpc).pp);
    return CVar12;
  }
  size_00 = &nread;
  CVar12 = ftp_readresp(data,conn->sock[0],&(paVar1->ftpc).pp,&ftpcode,size_00);
  if (CVar12 != CURLE_OK) {
    return CVar12;
  }
  if (ftpcode == 0) {
    return CURLE_OK;
  }
  instate = (conn->proto).ftpc.state;
  switch(instate) {
  case FTP_WAIT220:
    if (ftpcode == 0xdc) {
      if (((data->set).use_ssl != CURLUSESSL_NONE) && (((conn->bits).field_0x6 & 0x40) == 0)) {
        (conn->proto).ftpc.count3 = 0;
        uVar21 = (ulong)(data->set).ftpsslauth;
        if (2 < uVar21) {
          Curl_failf(data,"unsupported parameter to CURLOPT_FTPSSLAUTH: %d");
          return CURLE_UNKNOWN_OPTION;
        }
        iVar13 = *(int *)(&DAT_001560f0 + uVar21 * 4);
        lVar17 = *(long *)(&DAT_00156100 + uVar21 * 8);
        (conn->proto).ftpc.count2 = *(int *)(&DAT_001560e4 + uVar21 * 4);
        (conn->proto).ftpc.count1 = iVar13;
        CVar12 = Curl_pp_sendf(data,&(paVar1->ftpc).pp,"AUTH %s",ftp_statemachine::ftpauth + lVar17)
        ;
        if (CVar12 == CURLE_OK) {
          (data->conn->proto).ftpc.state = FTP_AUTH;
          return CURLE_OK;
        }
        return CVar12;
      }
      goto LAB_0011ab07;
    }
    if (ftpcode != 0xe6) {
      Curl_failf(data,"Got a %03d ftp-server response when 220 was expected",(ulong)(uint)ftpcode);
      return CURLE_WEIRD_SERVER_REPLY;
    }
    goto LAB_0011a340;
  case FTP_AUTH:
    if ((ftpcode == 0x14e) || (ftpcode == 0xea)) {
      CVar12 = Curl_ssl_connect(data,conn,0);
      if (CVar12 != CURLE_OK) {
        return CVar12;
      }
      *(ulong *)&(conn->bits).field_0x4 =
           *(ulong *)&(conn->bits).field_0x4 & 0xffffffffff9fffff | 0x400000;
LAB_0011ab07:
      CVar12 = ftp_state_user(data,conn);
      return CVar12;
    }
    iVar13 = (conn->proto).ftpc.count3;
    if (0 < iVar13) {
      if (CURLUSESSL_TRY < (data->set).use_ssl) {
        return CURLE_USE_SSL_FAILED;
      }
      goto LAB_0011ab07;
    }
    (conn->proto).ftpc.count3 = iVar13 + 1;
    lVar17 = (long)(conn->proto).ftpc.count1 + (long)(conn->proto).ftpc.count2;
    (conn->proto).ftpc.count1 = (int)lVar17;
    pacVar20 = ftp_statemachine::ftpauth + lVar17;
    pcVar24 = "AUTH %s";
    goto LAB_0011a6f6;
  case FTP_USER:
  case FTP_PASS:
    pcVar25 = data->conn;
    paVar1 = &pcVar25->proto;
    if (ftpcode == 0x14b) {
      if ((pcVar25->proto).ftpc.state == FTP_USER) {
        pcVar24 = "";
        if (pcVar25->passwd != (char *)0x0) {
          pcVar24 = pcVar25->passwd;
        }
        CVar12 = Curl_pp_sendf(data,&(paVar1->ftpc).pp,"PASS %s",pcVar24);
        if (CVar12 == CURLE_OK) {
          (data->conn->proto).ftpc.state = FTP_PASS;
          return CURLE_OK;
        }
        return CVar12;
      }
LAB_0011a81e:
      if (((data->set).str[0xb] != (char *)0x0) && (((data->state).field_0x660 & 0x40) == 0)) {
        CVar12 = Curl_pp_sendf(data,&(paVar1->ftpc).pp,"%s");
        if (CVar12 == CURLE_OK) {
          puVar3 = &(data->state).field_0x660;
          *puVar3 = *puVar3 | 0x40;
          (data->conn->proto).ftpc.state = FTP_USER;
          return CURLE_OK;
        }
        return CVar12;
      }
      Curl_failf(data,"Access denied: %03d",(ulong)(uint)ftpcode);
    }
    else {
      if (ftpcode - 200U < 100) goto LAB_0011a340;
      if (ftpcode != 0x14c) goto LAB_0011a81e;
      if ((data->set).str[10] != (char *)0x0) {
        CVar12 = Curl_pp_sendf(data,&(paVar1->ftpc).pp,"ACCT %s");
        if (CVar12 == CURLE_OK) {
          (data->conn->proto).ftpc.state = FTP_ACCT;
          return CURLE_OK;
        }
        return CVar12;
      }
      Curl_failf(data,"ACCT requested but none available");
    }
    CVar12 = CURLE_LOGIN_DENIED;
    break;
  case FTP_ACCT:
    if (ftpcode != 0xe6) {
      Curl_failf(data,"ACCT rejected by server: %03d",(ulong)(uint)ftpcode);
      return CURLE_FTP_WEIRD_PASS_REPLY;
    }
LAB_0011a340:
    CVar12 = ftp_state_loggedin(data);
    break;
  case FTP_PBSZ:
    uVar10 = 0x50;
    if ((data->set).use_ssl == CURLUSESSL_CONTROL) {
      uVar10 = 0x43;
    }
    CVar12 = Curl_pp_sendf(data,&(paVar1->ftpc).pp,"PROT %c",uVar10);
    if (CVar12 == CURLE_OK) {
      (data->conn->proto).ftpc.state = FTP_PROT;
      CVar12 = CURLE_OK;
    }
    break;
  case FTP_PROT:
    cVar5 = (data->set).use_ssl;
    if (ftpcode - 200U < 100) {
      *(ulong *)&(conn->bits).field_0x4 =
           *(ulong *)&(conn->bits).field_0x4 & 0xffffffffffdfffff |
           (ulong)(cVar5 != CURLUSESSL_CONTROL) << 0x15;
    }
    else if (CURLUSESSL_CONTROL < cVar5) {
      return CURLE_USE_SSL_FAILED;
    }
    if ((data->set).ftp_ccc != CURLFTPSSL_CCC_NONE) {
      CVar12 = Curl_pp_sendf(data,&(paVar1->ftpc).pp,"%s","CCC");
      if (CVar12 == CURLE_OK) {
        (data->conn->proto).ftpc.state = FTP_CCC;
        return CURLE_OK;
      }
      return CVar12;
    }
    goto LAB_0011a910;
  case FTP_CCC:
    if ((ftpcode < 500) && (CVar12 = Curl_ssl_shutdown(data,conn,0), CVar12 != CURLE_OK)) {
      Curl_failf(data,"Failed to clear the command channel (CCC)");
      return CVar12;
    }
LAB_0011a910:
    CVar12 = ftp_state_pwd(data,conn);
    break;
  case FTP_PWD:
    if (ftpcode == 0x101) {
      pcVar24 = (data->state).buffer;
      lVar17 = (data->set).buffer_size;
      pcVar18 = (char *)(*Curl_cmalloc)(nread + 1);
      if (pcVar18 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      for (pcVar24 = pcVar24 + 4; cVar4 = *pcVar24, pcVar19 = pcVar18,
          pcVar24 < (data->state).buffer + lVar17; pcVar24 = pcVar24 + 1) {
        if ((cVar4 == '\0') || (cVar4 == '\n')) goto LAB_0011b01f;
        if (cVar4 == '\"') goto LAB_0011af18;
      }
      if (cVar4 == '\"') {
LAB_0011af18:
        do {
          cVar4 = pcVar24[1];
          if (cVar4 == '\"') {
            if (pcVar24[2] != '\"') {
              *pcVar19 = '\0';
              if (((conn->proto).ftpc.server_os != (char *)0x0) || (*pcVar18 == '/')) {
                (*Curl_cfree)((conn->proto).ftpc.entrypath);
                (conn->proto).ftpc.entrypath = pcVar18;
                Curl_infof(data,"Entry path is \'%s\'",pcVar18);
                (data->state).most_recent_ftp_entrypath = (conn->proto).ftpc.entrypath;
                goto switchD_00119f1a_default;
              }
              CVar12 = Curl_pp_sendf(data,&(paVar1->ftpc).pp,"%s","SYST");
              if (CVar12 == CURLE_OK) {
                (*Curl_cfree)((conn->proto).ftpc.entrypath);
                (conn->proto).ftpc.entrypath = pcVar18;
                Curl_infof(data,"Entry path is \'%s\'",pcVar18);
                (data->state).most_recent_ftp_entrypath = (conn->proto).ftpc.entrypath;
                (data->conn->proto).ftpc.state = FTP_SYST;
                return CURLE_OK;
              }
              goto LAB_0011ac0f;
            }
            pcVar24 = pcVar24 + 2;
          }
          else {
            if (cVar4 == '\0') goto LAB_0011b01c;
            pcVar24 = pcVar24 + 1;
          }
          *pcVar19 = cVar4;
          pcVar19 = pcVar19 + 1;
        } while( true );
      }
      goto LAB_0011b01f;
    }
  default:
switchD_00119f1a_default:
    (data->conn->proto).ftpc.state = FTP_STOP;
    CVar12 = CURLE_OK;
    break;
  case FTP_SYST:
    if (ftpcode == 0xd7) {
      pcVar24 = (data->state).buffer;
      pcVar18 = (char *)(*Curl_cmalloc)(nread + 1);
      if (pcVar18 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      pbVar26 = (byte *)(pcVar24 + 4);
      do {
        bVar11 = *pbVar26;
        pbVar26 = pbVar26 + 1;
      } while (bVar11 == 0x20);
      lVar17 = 0;
      while ((bVar11 & 0xdf) != 0) {
        pcVar18[lVar17] = bVar11;
        pbVar15 = pbVar26 + lVar17;
        lVar17 = lVar17 + 1;
        bVar11 = *pbVar15;
      }
      pcVar18[lVar17] = '\0';
      iVar13 = Curl_strcasecompare(pcVar18,"OS/400");
      if (iVar13 != 0) {
        CVar12 = Curl_pp_sendf(data,&(paVar1->ftpc).pp,"%s","SITE NAMEFMT 1");
        if (CVar12 == CURLE_OK) {
          (*Curl_cfree)((conn->proto).ftpc.server_os);
          (conn->proto).ftpc.server_os = pcVar18;
          (data->conn->proto).ftpc.state = FTP_NAMEFMT;
          return CURLE_OK;
        }
LAB_0011ac0f:
        (*Curl_cfree)(pcVar18);
        return CVar12;
      }
      (*Curl_cfree)((conn->proto).ftpc.server_os);
      (conn->proto).ftpc.server_os = pcVar18;
    }
    goto switchD_00119f1a_default;
  case FTP_NAMEFMT:
    if (ftpcode == 0xfa) {
      ftp_state_pwd(data,conn);
      return CURLE_OK;
    }
    goto switchD_00119f1a_default;
  case FTP_QUOTE:
  case FTP_RETR_PREQUOTE:
  case FTP_STOR_PREQUOTE:
  case FTP_POSTQUOTE:
    if ((ftpcode < 400) || ((conn->proto).ftpc.count2 != 0)) {
      CVar12 = ftp_state_quote(data,false,instate);
    }
    else {
      Curl_failf(data,"QUOT command failed with %03d",(ulong)(uint)ftpcode);
      CVar12 = CURLE_QUOTE_ERROR;
    }
    break;
  case FTP_CWD:
    if (99 < ftpcode - 200U) {
      if ((((data->set).ftp_create_missing_dirs != 0) &&
          (lVar17 = (long)(conn->proto).ftpc.cwdcount, lVar17 != 0)) &&
         ((conn->proto).ftpc.count2 == 0)) {
        (conn->proto).ftpc.count2 = 1;
        CVar12 = Curl_pp_sendf(data,&(paVar1->ftpc).pp,"MKD %s",
                               *(undefined8 *)(((conn->proto).pop3c.strip - 8) + lVar17 * 8));
        if (CVar12 == CURLE_OK) {
          (data->conn->proto).ftpc.state = FTP_MKD;
          return CURLE_OK;
        }
        return CVar12;
      }
      Curl_failf(data,"Server denied you to change to the given directory");
      (conn->proto).ftpc.cwdfail = true;
      return CURLE_REMOTE_ACCESS_DENIED;
    }
    (conn->proto).ftpc.count2 = 0;
    iVar13 = (conn->proto).ftpc.cwdcount;
    (conn->proto).ftpc.cwdcount = iVar13 + 1;
    if ((conn->proto).ftpc.dirdepth <= iVar13) {
      CVar12 = ftp_state_mdtm(data);
      return CVar12;
    }
    pacVar20 = (char (*) [4])(conn->proto).ftpc.dirs[iVar13];
    goto LAB_0011a6ef;
  case FTP_MKD:
    if (99 < ftpcode - 200U) {
      piVar2 = &(conn->proto).ftpc.count3;
      iVar13 = *piVar2;
      *piVar2 = *piVar2 + -1;
      if (iVar13 == 0) {
        Curl_failf(data,"Failed to MKD dir: %03d",(ulong)(uint)ftpcode);
        return CURLE_REMOTE_ACCESS_DENIED;
      }
    }
    (data->conn->proto).ftpc.state = FTP_CWD;
    pacVar20 = *(char (**) [4])
                (((conn->proto).pop3c.strip - 8) + (long)(conn->proto).ftpc.cwdcount * 8);
LAB_0011a6ef:
    pcVar24 = "CWD %s";
LAB_0011a6f6:
    CVar12 = Curl_pp_sendf(data,&(paVar1->ftpc).pp,pcVar24,pacVar20);
    break;
  case FTP_MDTM:
    pFVar8 = (data->req).p.file;
    if (ftpcode == 0x226) {
      bVar29 = false;
      Curl_failf(data,"Given file does not exist");
      CVar12 = CURLE_REMOTE_FILE_NOT_FOUND;
    }
    else {
      if (ftpcode == 0xd5) {
        pcVar25 = data->conn;
        iVar13 = __isoc99_sscanf((data->state).buffer + 4,"%04d%02d%02d%02d%02d%02d",&year,&month,
                                 &day,&hour,&minute,&second);
        if (iVar13 == 6) {
          curl_msnprintf((char *)&size,0x18,"%04d%02d%02d %02d:%02d:%02d GMT",_year & 0xffffffff,
                         (ulong)(uint)month,(ulong)(uint)day,(ulong)(uint)hour,(ulong)(uint)minute,
                         (ulong)(uint)second);
          tVar16 = Curl_getdate_capped((char *)&size);
          (data->info).filetime = tVar16;
        }
        uVar27 = (uint)*(undefined8 *)&(data->set).field_0x9a0;
        if (((((uVar27 >> 0x1c & 1) != 0) && ((uVar27 >> 9 & 1) != 0)) &&
            ((pcVar25->proto).ftpc.file != (char *)0x0)) &&
           (lVar17 = (data->info).filetime, -1 < lVar17)) {
          CVar12 = Curl_gmtime(lVar17,(tm *)&filesize);
          if (CVar12 != CURLE_OK) {
            return CVar12;
          }
          iVar13 = 6;
          if (local_158 != 0) {
            iVar13 = local_158 + -1;
          }
          iVar13 = curl_msnprintf((char *)&size,0x80,
                                  "Last-Modified: %s, %02d %s %4d %02d:%02d:%02d GMT\r\n",
                                  Curl_wkday[iVar13],(ulong)local_164,Curl_month[local_160],
                                  (ulong)(local_15c + 0x76c),(ulong)local_168,
                                  (ulong)filesize >> 0x20,filesize & 0xffffffff);
          CVar12 = Curl_client_write(data,3,(char *)&size,(long)iVar13);
          if (CVar12 != CURLE_OK) {
            return CVar12;
          }
        }
      }
      else {
        Curl_infof(data,"unsupported MDTM reply format");
      }
      CVar12 = CURLE_OK;
      bVar29 = true;
    }
    cVar6 = (data->set).timecondition;
    if (cVar6 != CURL_TIMECOND_NONE) {
      uVar21 = (data->info).filetime;
      if (((long)uVar21 < 1) || (uVar9 = (data->set).timevalue, (long)uVar9 < 1)) {
        Curl_infof(data,"Skipping time comparison");
      }
      else if (cVar6 == CURL_TIMECOND_IFUNMODSINCE) {
        if (uVar9 < uVar21) {
          pcVar24 = "The requested document is not old enough";
LAB_0011aed6:
          Curl_infof(data,pcVar24);
          pFVar8->fd = 2;
          puVar3 = &(data->info).field_0xe4;
          *puVar3 = *puVar3 | 1;
          goto switchD_00119f1a_default;
        }
      }
      else if (uVar21 <= uVar9) {
        pcVar24 = "The requested document is not new enough";
        goto LAB_0011aed6;
      }
    }
    if (bVar29) {
      CVar12 = ftp_state_type(data);
    }
    break;
  case FTP_TYPE:
  case FTP_LIST_TYPE:
  case FTP_RETR_TYPE:
  case FTP_STOR_TYPE:
    CVar12 = ftp_state_type_resp(data,ftpcode,instate);
    break;
  case FTP_SIZE:
  case FTP_RETR_SIZE:
  case FTP_STOR_SIZE:
    filesize = -1;
    if (ftpcode == 0xd5) {
      pbVar26 = (byte *)((data->state).buffer + 4);
      pbVar15 = (byte *)strchr((char *)pbVar26,0xd);
      if (pbVar15 != (byte *)0x0) {
        do {
          pbVar28 = pbVar15;
          pbVar15 = pbVar28 + -1;
          iVar13 = Curl_isdigit((uint)pbVar28[-1]);
          if (pbVar15 <= pbVar26) break;
        } while (iVar13 != 0);
        iVar13 = Curl_isdigit((uint)*pbVar15);
        pbVar26 = pbVar28;
        if (iVar13 != 0) {
          pbVar26 = pbVar15;
        }
      }
      curlx_strtoofft((char *)pbVar26,(char **)0x0,0,&filesize);
    }
    else if (instate != FTP_STOR_SIZE && ftpcode == 0x226) {
      Curl_failf(data,"The file does not exist");
      return CURLE_REMOTE_FILE_NOT_FOUND;
    }
    if (instate == FTP_STOR_SIZE) {
      (data->state).resume_from = filesize;
      CVar12 = ftp_state_ul_setup(data,true);
    }
    else if (instate == FTP_RETR_SIZE) {
      Curl_pgrsSetDownloadSize(data,filesize);
      CVar12 = ftp_state_retr(data,filesize);
    }
    else {
      CVar12 = CURLE_OK;
      if (instate == FTP_SIZE) {
        if (filesize == -1) {
          cVar23 = -1;
        }
        else {
          iVar13 = curl_msnprintf((char *)&size,0x80,"Content-Length: %ld\r\n");
          CVar12 = Curl_client_write(data,3,(char *)&size,(long)iVar13);
          cVar23 = filesize;
          if (CVar12 != CURLE_OK) {
            return CVar12;
          }
        }
        Curl_pgrsSetDownloadSize(data,cVar23);
        CVar12 = ftp_state_rest(data,data->conn);
      }
    }
    break;
  case FTP_REST:
  case FTP_RETR_REST:
    if (instate == FTP_RETR_REST) {
      if (ftpcode == 0x15e) {
        CVar12 = Curl_pp_sendf(data,&(paVar1->ftpc).pp,"RETR %s",(conn->proto).ftpc.file);
        if (CVar12 == CURLE_OK) {
          (data->conn->proto).ftpc.state = FTP_RETR;
          CVar12 = CURLE_OK;
        }
      }
      else {
        Curl_failf(data,"Couldn\'t use REST");
        CVar12 = CURLE_FTP_COULDNT_USE_REST;
      }
    }
    else {
      if (ftpcode == 0x15e) {
        size._0_1_ = 'A';
        size._1_1_ = 'c';
        size._2_1_ = 'c';
        size._3_1_ = 'e';
        size._4_1_ = 'p';
        size._5_1_ = 't';
        size._6_1_ = '-';
        size._7_1_ = 'r';
        uStack_130._0_1_ = 'a';
        uStack_130._1_1_ = 'n';
        uStack_130._2_1_ = 'g';
        uStack_130._3_1_ = 'e';
        uStack_130._4_1_ = 's';
        uStack_130._5_1_ = ':';
        uStack_130._6_1_ = ' ';
        uStack_130._7_1_ = 'b';
        local_128 = 0xa0d73657479;
        len = strlen((char *)&size);
        CVar12 = Curl_client_write(data,3,(char *)&size,len);
        if (CVar12 != CURLE_OK) {
          return CVar12;
        }
      }
      CVar12 = ftp_state_prepare_transfer(data);
    }
    break;
  case FTP_PORT:
    if (ftpcode - 200U < 100) {
      Curl_infof(data,"Connect data stream actively");
      (data->conn->proto).ftpc.state = FTP_STOP;
      CVar12 = ftp_dophase_done(data,false);
    }
    else {
      pcVar25 = data->conn;
      iVar13 = (pcVar25->proto).ftpc.count1;
      if (iVar13 == 0) {
        Curl_infof(data,"disabling EPRT usage");
        puVar3 = &(pcVar25->bits).field_0x6;
        *puVar3 = *puVar3 & 0xef;
        fcmd = PORT;
      }
      else {
        fcmd = iVar13 + PORT;
        if (fcmd == DONE) {
          Curl_failf(data,"Failed to do PORT");
          return CURLE_FTP_PORT_FAILED;
        }
      }
      CVar12 = ftp_state_use_port(data,fcmd);
    }
    break;
  case FTP_PRET:
    if (ftpcode == 200) {
      CVar12 = ftp_state_use_pasv(data,conn);
    }
    else {
      Curl_failf(data,"PRET command not accepted: %03d",(ulong)(uint)ftpcode);
      CVar12 = CURLE_FTP_PRET_FAILED;
    }
    break;
  case FTP_PASV:
    pcVar25 = data->conn;
    filesize = 0;
    pcVar24 = (data->state).buffer + 4;
    (*Curl_cfree)((pcVar25->proto).ftpc.newhost);
    (pcVar25->proto).ftpc.newhost = (char *)0x0;
    iVar13 = (pcVar25->proto).ftpc.count1;
    if (ftpcode == 0xe5 && iVar13 == 0) {
      pcVar24 = strchr(pcVar24,0x28);
      if ((pcVar24 == (char *)0x0) ||
         (iVar13 = __isoc99_sscanf(pcVar24 + 1,"%c%c%c%u%c",&year,(long)&year + 1,(long)&year + 2,
                                   &size,(long)&year + 3), iVar13 != 5)) {
LAB_0011a6b8:
        pcVar24 = "Weirdly formatted EPSV reply";
      }
      else {
        lVar17 = 1;
        do {
          if (lVar17 == 4) {
            if (0xffff < (uint)size) goto LAB_0011af54;
            (pcVar25->proto).ftpc.newport = (unsigned_short)size;
            if (((pcVar25->bits).field_0x4 & 10) == 0) {
              pcVar24 = pcVar25->primary_ip;
            }
            else {
              pcVar24 = (pcVar25->host).name;
            }
            pcVar24 = (*Curl_cstrdup)(pcVar24);
            (pcVar25->proto).ftpc.newhost = pcVar24;
            if (pcVar24 == (char *)0x0) {
              return CURLE_OUT_OF_MEMORY;
            }
            goto LAB_0011b22b;
          }
          lVar22 = lVar17 + -4;
          lVar17 = lVar17 + 1;
        } while (auStack_19c[lVar22] == (char)year);
        if ((uint)size < 0x10000) goto LAB_0011a6b8;
LAB_0011af54:
        pcVar24 = "Illegal port number in EPSV reply";
      }
      Curl_failf(data,pcVar24);
    }
    else {
      if (ftpcode == 0xe3 && iVar13 == 1) {
        size = 0;
        uStack_130 = 0;
        _year = 0;
        local_198 = pcVar25;
        for (; uVar30 = SUB84(size_00,0), *pcVar24 != '\0'; pcVar24 = pcVar24 + 1) {
          size_00 = &uStack_130;
          iVar13 = __isoc99_sscanf(pcVar24,"%u,%u,%u,%u,%u,%u",&size,(long)&size + 4,size_00,
                                   (long)&uStack_130 + 4,&year,auStack_19c);
          uVar30 = SUB84(size_00,0);
          if (iVar13 == 6) {
            bVar29 = *pcVar24 == '\0';
            goto LAB_0011ae02;
          }
        }
        bVar29 = true;
LAB_0011ae02:
        pcVar25 = local_198;
        auVar31._8_8_ = _year;
        auVar31._0_8_ = uStack_130;
        auVar31 = auVar31 ^ _DAT_00155fd0;
        auVar32._0_4_ = -(uint)(-0x7fffff01 < auVar31._0_4_);
        auVar32._4_4_ = -(uint)(-0x7fffff01 < auVar31._4_4_);
        auVar32._8_4_ = -(uint)(-0x7fffff01 < auVar31._8_4_);
        auVar32._12_4_ = -(uint)(-0x7fffff01 < auVar31._12_4_);
        iVar13 = movmskps(uVar30,auVar32);
        if ((bool)(0xff < (uint)size | bVar29 | 0xff < size._4_4_ | iVar13 != 0)) {
          Curl_failf(data,"Couldn\'t interpret the 227-response");
          return CURLE_FTP_WEIRD_227_FORMAT;
        }
        uVar30 = (undefined4)(uStack_130 >> 0x20);
        if (((data->set).field_0x9a2 & 4) == 0) {
          pcVar24 = curl_maprintf("%u.%u.%u.%u",size & 0xffffffff,(ulong)size._4_4_,
                                  uStack_130 & 0xffffffff,uVar30);
        }
        else {
          Curl_infof(data,"Skip %u.%u.%u.%u for data connection, re-use %s instead",
                     size & 0xffffffff,(ulong)size._4_4_,uStack_130 & 0xffffffff,uVar30,
                     (local_198->host).name);
          if (((pcVar25->bits).field_0x4 & 10) == 0) {
            pcVar24 = pcVar25->primary_ip;
          }
          else {
            pcVar24 = (pcVar25->host).name;
          }
          pcVar24 = (*Curl_cstrdup)(pcVar24);
        }
        (pcVar25->proto).ftpc.newhost = pcVar24;
        if (pcVar24 == (char *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        (pcVar25->proto).ftpc.newport = (short)(year << 8) + (short)(_year >> 0x20);
LAB_0011b22b:
        uVar21 = *(ulong *)&(pcVar25->bits).field_0x4;
        uVar27 = (uint)uVar21;
        if ((uVar27 >> 10 & 1) == 0) {
          if (((uVar27 & 0x4000040) == 0x4000000) && (*pcVar24 == '\0')) {
            Curl_conninfo_remote(data,pcVar25,pcVar25->sock[0]);
            (*Curl_cfree)((pcVar25->proto).ftpc.newhost);
            (pcVar25->proto).ftpc.newhost = (char *)0x0;
            if (((pcVar25->bits).field_0x4 & 10) == 0) {
              pcVar24 = pcVar25->primary_ip;
            }
            else {
              pcVar24 = (pcVar25->host).name;
            }
            pcVar24 = (*Curl_cstrdup)(pcVar24);
            (pcVar25->proto).ftpc.newhost = pcVar24;
            if (pcVar24 == (char *)0x0) {
              return CURLE_OUT_OF_MEMORY;
            }
          }
          rVar14 = Curl_resolv(data,pcVar24,(uint)(pcVar25->proto).ftpc.newport,false,
                               (Curl_dns_entry **)&filesize);
          if (rVar14 == CURLRESOLV_PENDING) {
            Curl_resolver_wait_resolv(data,(Curl_dns_entry **)&filesize);
          }
          uVar27 = (uint)(pcVar25->proto).ftpc.newport;
          if (filesize == 0) {
            Curl_failf(data,"Can\'t resolve new host %s:%hu",(pcVar25->proto).ftpc.newhost,
                       (ulong)uVar27);
            return CURLE_FTP_CANT_GET_HOST;
          }
        }
        else {
          hostname = pcVar25->tempaddr[(ulong)((uVar21 & 2) == 0) * 8 + 0xf];
          rVar14 = Curl_resolv(data,(char *)hostname,pcVar25->port,false,
                               (Curl_dns_entry **)&filesize);
          if (rVar14 == CURLRESOLV_PENDING) {
            Curl_resolver_wait_resolv(data,(Curl_dns_entry **)&filesize);
          }
          uVar27 = pcVar25->port;
          if (filesize == 0) {
            Curl_failf(data,"Can\'t resolve proxy host %s:%hu",hostname,(ulong)(uVar27 & 0xffff));
            return CURLE_COULDNT_RESOLVE_PROXY;
          }
        }
        (pcVar25->bits).tcpconnect[1] = false;
        CVar12 = Curl_connecthost(data,pcVar25,(Curl_dns_entry *)filesize);
        if (CVar12 == CURLE_OK) {
          if (((data->set).field_0x9a3 & 0x40) != 0) {
            pcVar24 = (pcVar25->proto).ftpc.newhost;
            Curl_printable_address(*(Curl_addrinfo **)filesize,(char *)&size,0x100);
            Curl_infof(data,"Connecting to %s (%s) port %d",pcVar24,&size,(ulong)(uVar27 & 0xffff));
          }
          Curl_resolv_unlock(data,(Curl_dns_entry *)filesize);
          (*Curl_cfree)(pcVar25->secondaryhostname);
          pcVar25->secondaryhostname = (char *)0x0;
          pcVar25->secondary_port = (pcVar25->proto).ftpc.newport;
          pcVar24 = (*Curl_cstrdup)((pcVar25->proto).ftpc.newhost);
          pcVar25->secondaryhostname = pcVar24;
          if (pcVar24 == (char *)0x0) {
            return CURLE_OUT_OF_MEMORY;
          }
          puVar3 = &(pcVar25->bits).field_0x5;
          *puVar3 = *puVar3 | 0x40;
          (data->conn->proto).ftpc.state = FTP_STOP;
          return CURLE_OK;
        }
        Curl_resolv_unlock(data,(Curl_dns_entry *)filesize);
        if (ftpcode != 0xe5) {
          return CVar12;
        }
        if ((pcVar25->proto).ftpc.count1 != 0) {
          return CVar12;
        }
LAB_0011b42d:
        CVar12 = ftp_epsv_disable(data,pcVar25);
        return CVar12;
      }
      if (iVar13 == 0) goto LAB_0011b42d;
      Curl_failf(data,"Bad PASV/EPSV response: %03d",(ulong)(uint)ftpcode);
    }
    CVar12 = CURLE_FTP_WEIRD_PASV_REPLY;
    break;
  case FTP_LIST:
  case FTP_RETR:
    pcVar25 = data->conn;
    pFVar7 = (data->req).p.ftp;
    if ((ftpcode != 0x96) && (ftpcode != 0x7d)) {
      if (ftpcode == 0x1c2 && instate == FTP_LIST) {
        pFVar7->transfer = PPTRANSFER_NONE;
        (pcVar25->proto).ftpc.state = FTP_STOP;
        return CURLE_OK;
      }
      Curl_failf(data,"RETR response: %03d",(ulong)(uint)ftpcode);
      if (ftpcode == 0x226 && instate == FTP_RETR) {
        return CURLE_REMOTE_FILE_NOT_FOUND;
      }
      return CURLE_FTP_COULDNT_RETR_FILE;
    }
    size = -1;
    if (((instate == FTP_LIST) || (((data->state).field_0x662 & 1) != 0)) ||
       (0 < pFVar7->downloadsize)) {
      lVar17 = pFVar7->downloadsize;
      cVar23 = lVar17;
      if (lVar17 < 0) {
        lVar17 = -1;
        cVar23 = size;
      }
    }
    else {
      pcVar24 = (data->state).buffer;
      local_198 = pcVar25;
      pcVar18 = strstr(pcVar24," bytes");
      lVar17 = -1;
      pcVar25 = local_198;
      cVar23 = size;
      if (pcVar18 != (char *)0x0) {
        pcVar24 = pcVar24 + (2 - (long)pcVar18);
        for (; (pcVar24 != (char *)0x0 && ((byte)pcVar18[-1] != 0x28)); pcVar18 = pcVar18 + -1) {
          iVar13 = Curl_isdigit((uint)(byte)pcVar18[-1]);
          pcVar25 = local_198;
          cVar23 = size;
          if (iVar13 == 0) goto LAB_0011b0ba;
          pcVar24 = pcVar24 + 1;
        }
        curlx_strtoofft(pcVar18,(char **)0x0,0,&size);
        lVar17 = size;
        pcVar25 = local_198;
        cVar23 = size;
      }
    }
LAB_0011b0ba:
    size = cVar23;
    lVar22 = (data->req).maxdownload;
    if (lVar22 < 1 || lVar17 <= lVar22) {
      if (instate != FTP_LIST) {
        if (((data->state).field_0x662 & 1) != 0) {
          size = -1;
        }
        goto LAB_0011b0dd;
      }
      pcVar24 = "Maxdownload = %ld";
LAB_0011b113:
      Curl_infof(data,pcVar24,lVar22);
    }
    else {
      (data->req).size = lVar22;
      size = lVar22;
LAB_0011b0dd:
      Curl_infof(data,"Maxdownload = %ld");
      if (instate != FTP_LIST) {
        pcVar24 = "Getting file with size: %ld";
        lVar22 = size;
        goto LAB_0011b113;
      }
    }
    (pcVar25->proto).ftpc.state_saved = instate;
    (pcVar25->proto).ftpc.retr_size_saved = size;
    if (((data->set).field_0x9a1 & 0x40) != 0) {
      CVar12 = AllowServerConnect(data,(_Bool *)&filesize);
      if (CVar12 != CURLE_OK) {
        return CVar12;
      }
      if ((char)filesize == '\0') {
        Curl_infof(data,"Data conn was not available immediately");
        (data->conn->proto).ftpc.state = FTP_STOP;
        (pcVar25->proto).ftpc.wait_data_conn = true;
        return CURLE_OK;
      }
      return CURLE_OK;
    }
    goto LAB_0011b139;
  case FTP_STOR:
    if (399 < ftpcode) {
      Curl_failf(data,"Failed FTP upload: %0d",(ulong)(uint)ftpcode);
      (data->conn->proto).ftpc.state = FTP_STOP;
      return CURLE_UPLOAD_FAILED;
    }
    pcVar25 = data->conn;
    (pcVar25->proto).ftpc.state_saved = FTP_STOR;
    if (((data->set).field_0x9a1 & 0x40) != 0) {
      (data->conn->proto).ftpc.state = FTP_STOP;
      CVar12 = AllowServerConnect(data,(_Bool *)&size);
      if (CVar12 != CURLE_OK) {
        return CVar12;
      }
      if ((char)size == '\0') {
        Curl_infof(data,"Data conn was not available immediately");
        (pcVar25->proto).ftpc.wait_data_conn = true;
        return CURLE_OK;
      }
      return CURLE_OK;
    }
LAB_0011b139:
    CVar12 = InitiateTransfer(data);
  }
  return CVar12;
LAB_0011b01c:
  *pcVar19 = '\0';
LAB_0011b01f:
  (*Curl_cfree)(pcVar18);
  Curl_infof(data,"Failed to figure out path");
  goto switchD_00119f1a_default;
}

Assistant:

static CURLcode ftp_statemachine(struct Curl_easy *data,
                                 struct connectdata *conn)
{
  CURLcode result;
  curl_socket_t sock = conn->sock[FIRSTSOCKET];
  int ftpcode;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  struct pingpong *pp = &ftpc->pp;
  static const char ftpauth[][4]  = { "SSL", "TLS" };
  size_t nread = 0;

  if(pp->sendleft)
    return Curl_pp_flushsend(data, pp);

  result = ftp_readresp(data, sock, pp, &ftpcode, &nread);
  if(result)
    return result;

  if(ftpcode) {
    /* we have now received a full FTP server response */
    switch(ftpc->state) {
    case FTP_WAIT220:
      if(ftpcode == 230)
        /* 230 User logged in - already! */
        return ftp_state_user_resp(data, ftpcode, ftpc->state);
      else if(ftpcode != 220) {
        failf(data, "Got a %03d ftp-server response when 220 was expected",
              ftpcode);
        return CURLE_WEIRD_SERVER_REPLY;
      }

      /* We have received a 220 response fine, now we proceed. */
#ifdef HAVE_GSSAPI
      if(data->set.krb) {
        /* If not anonymous login, try a secure login. Note that this
           procedure is still BLOCKING. */

        Curl_sec_request_prot(conn, "private");
        /* We set private first as default, in case the line below fails to
           set a valid level */
        Curl_sec_request_prot(conn, data->set.str[STRING_KRB_LEVEL]);

        if(Curl_sec_login(data, conn))
          infof(data, "Logging in with password in cleartext!");
        else
          infof(data, "Authentication successful");
      }
#endif

      if(data->set.use_ssl && !conn->bits.ftp_use_control_ssl) {
        /* We don't have a SSL/TLS control connection yet, but FTPS is
           requested. Try a FTPS connection now */

        ftpc->count3 = 0;
        switch(data->set.ftpsslauth) {
        case CURLFTPAUTH_DEFAULT:
        case CURLFTPAUTH_SSL:
          ftpc->count2 = 1; /* add one to get next */
          ftpc->count1 = 0;
          break;
        case CURLFTPAUTH_TLS:
          ftpc->count2 = -1; /* subtract one to get next */
          ftpc->count1 = 1;
          break;
        default:
          failf(data, "unsupported parameter to CURLOPT_FTPSSLAUTH: %d",
                (int)data->set.ftpsslauth);
          return CURLE_UNKNOWN_OPTION; /* we don't know what to do */
        }
        result = Curl_pp_sendf(data, &ftpc->pp, "AUTH %s",
                               ftpauth[ftpc->count1]);
        if(!result)
          state(data, FTP_AUTH);
      }
      else
        result = ftp_state_user(data, conn);
      break;

    case FTP_AUTH:
      /* we have gotten the response to a previous AUTH command */

      /* RFC2228 (page 5) says:
       *
       * If the server is willing to accept the named security mechanism,
       * and does not require any security data, it must respond with
       * reply code 234/334.
       */

      if((ftpcode == 234) || (ftpcode == 334)) {
        /* Curl_ssl_connect is BLOCKING */
        result = Curl_ssl_connect(data, conn, FIRSTSOCKET);
        if(!result) {
          conn->bits.ftp_use_data_ssl = FALSE; /* clear-text data */
          conn->bits.ftp_use_control_ssl = TRUE; /* SSL on control */
          result = ftp_state_user(data, conn);
        }
      }
      else if(ftpc->count3 < 1) {
        ftpc->count3++;
        ftpc->count1 += ftpc->count2; /* get next attempt */
        result = Curl_pp_sendf(data, &ftpc->pp, "AUTH %s",
                               ftpauth[ftpc->count1]);
        /* remain in this same state */
      }
      else {
        if(data->set.use_ssl > CURLUSESSL_TRY)
          /* we failed and CURLUSESSL_CONTROL or CURLUSESSL_ALL is set */
          result = CURLE_USE_SSL_FAILED;
        else
          /* ignore the failure and continue */
          result = ftp_state_user(data, conn);
      }
      break;

    case FTP_USER:
    case FTP_PASS:
      result = ftp_state_user_resp(data, ftpcode, ftpc->state);
      break;

    case FTP_ACCT:
      result = ftp_state_acct_resp(data, ftpcode);
      break;

    case FTP_PBSZ:
      result =
        Curl_pp_sendf(data, &ftpc->pp, "PROT %c",
                      data->set.use_ssl == CURLUSESSL_CONTROL ? 'C' : 'P');
      if(!result)
        state(data, FTP_PROT);
      break;

    case FTP_PROT:
      if(ftpcode/100 == 2)
        /* We have enabled SSL for the data connection! */
        conn->bits.ftp_use_data_ssl =
          (data->set.use_ssl != CURLUSESSL_CONTROL) ? TRUE : FALSE;
      /* FTP servers typically responds with 500 if they decide to reject
         our 'P' request */
      else if(data->set.use_ssl > CURLUSESSL_CONTROL)
        /* we failed and bails out */
        return CURLE_USE_SSL_FAILED;

      if(data->set.ftp_ccc) {
        /* CCC - Clear Command Channel
         */
        result = Curl_pp_sendf(data, &ftpc->pp, "%s", "CCC");
        if(!result)
          state(data, FTP_CCC);
      }
      else
        result = ftp_state_pwd(data, conn);
      break;

    case FTP_CCC:
      if(ftpcode < 500) {
        /* First shut down the SSL layer (note: this call will block) */
        result = Curl_ssl_shutdown(data, conn, FIRSTSOCKET);

        if(result)
          failf(data, "Failed to clear the command channel (CCC)");
      }
      if(!result)
        /* Then continue as normal */
        result = ftp_state_pwd(data, conn);
      break;

    case FTP_PWD:
      if(ftpcode == 257) {
        char *ptr = &data->state.buffer[4];  /* start on the first letter */
        const size_t buf_size = data->set.buffer_size;
        char *dir;
        bool entry_extracted = FALSE;

        dir = malloc(nread + 1);
        if(!dir)
          return CURLE_OUT_OF_MEMORY;

        /* Reply format is like
           257<space>[rubbish]"<directory-name>"<space><commentary> and the
           RFC959 says

           The directory name can contain any character; embedded
           double-quotes should be escaped by double-quotes (the
           "quote-doubling" convention).
        */

        /* scan for the first double-quote for non-standard responses */
        while(ptr < &data->state.buffer[buf_size]
              && *ptr != '\n' && *ptr != '\0' && *ptr != '"')
          ptr++;

        if('\"' == *ptr) {
          /* it started good */
          char *store;
          ptr++;
          for(store = dir; *ptr;) {
            if('\"' == *ptr) {
              if('\"' == ptr[1]) {
                /* "quote-doubling" */
                *store = ptr[1];
                ptr++;
              }
              else {
                /* end of path */
                entry_extracted = TRUE;
                break; /* get out of this loop */
              }
            }
            else
              *store = *ptr;
            store++;
            ptr++;
          }
          *store = '\0'; /* null-terminate */
        }
        if(entry_extracted) {
          /* If the path name does not look like an absolute path (i.e.: it
             does not start with a '/'), we probably need some server-dependent
             adjustments. For example, this is the case when connecting to
             an OS400 FTP server: this server supports two name syntaxes,
             the default one being incompatible with standard paths. In
             addition, this server switches automatically to the regular path
             syntax when one is encountered in a command: this results in
             having an entrypath in the wrong syntax when later used in CWD.
               The method used here is to check the server OS: we do it only
             if the path name looks strange to minimize overhead on other
             systems. */

          if(!ftpc->server_os && dir[0] != '/') {
            result = Curl_pp_sendf(data, &ftpc->pp, "%s", "SYST");
            if(result) {
              free(dir);
              return result;
            }
            Curl_safefree(ftpc->entrypath);
            ftpc->entrypath = dir; /* remember this */
            infof(data, "Entry path is '%s'", ftpc->entrypath);
            /* also save it where getinfo can access it: */
            data->state.most_recent_ftp_entrypath = ftpc->entrypath;
            state(data, FTP_SYST);
            break;
          }

          Curl_safefree(ftpc->entrypath);
          ftpc->entrypath = dir; /* remember this */
          infof(data, "Entry path is '%s'", ftpc->entrypath);
          /* also save it where getinfo can access it: */
          data->state.most_recent_ftp_entrypath = ftpc->entrypath;
        }
        else {
          /* couldn't get the path */
          free(dir);
          infof(data, "Failed to figure out path");
        }
      }
      state(data, FTP_STOP); /* we are done with the CONNECT phase! */
      DEBUGF(infof(data, "protocol connect phase DONE"));
      break;

    case FTP_SYST:
      if(ftpcode == 215) {
        char *ptr = &data->state.buffer[4];  /* start on the first letter */
        char *os;
        char *store;

        os = malloc(nread + 1);
        if(!os)
          return CURLE_OUT_OF_MEMORY;

        /* Reply format is like
           215<space><OS-name><space><commentary>
        */
        while(*ptr == ' ')
          ptr++;
        for(store = os; *ptr && *ptr != ' ';)
          *store++ = *ptr++;
        *store = '\0'; /* null-terminate */

        /* Check for special servers here. */

        if(strcasecompare(os, "OS/400")) {
          /* Force OS400 name format 1. */
          result = Curl_pp_sendf(data, &ftpc->pp, "%s", "SITE NAMEFMT 1");
          if(result) {
            free(os);
            return result;
          }
          /* remember target server OS */
          Curl_safefree(ftpc->server_os);
          ftpc->server_os = os;
          state(data, FTP_NAMEFMT);
          break;
        }
        /* Nothing special for the target server. */
        /* remember target server OS */
        Curl_safefree(ftpc->server_os);
        ftpc->server_os = os;
      }
      else {
        /* Cannot identify server OS. Continue anyway and cross fingers. */
      }

      state(data, FTP_STOP); /* we are done with the CONNECT phase! */
      DEBUGF(infof(data, "protocol connect phase DONE"));
      break;

    case FTP_NAMEFMT:
      if(ftpcode == 250) {
        /* Name format change successful: reload initial path. */
        ftp_state_pwd(data, conn);
        break;
      }

      state(data, FTP_STOP); /* we are done with the CONNECT phase! */
      DEBUGF(infof(data, "protocol connect phase DONE"));
      break;

    case FTP_QUOTE:
    case FTP_POSTQUOTE:
    case FTP_RETR_PREQUOTE:
    case FTP_STOR_PREQUOTE:
      if((ftpcode >= 400) && !ftpc->count2) {
        /* failure response code, and not allowed to fail */
        failf(data, "QUOT command failed with %03d", ftpcode);
        result = CURLE_QUOTE_ERROR;
      }
      else
        result = ftp_state_quote(data, FALSE, ftpc->state);
      break;

    case FTP_CWD:
      if(ftpcode/100 != 2) {
        /* failure to CWD there */
        if(data->set.ftp_create_missing_dirs &&
           ftpc->cwdcount && !ftpc->count2) {
          /* try making it */
          ftpc->count2++; /* counter to prevent CWD-MKD loops */
          result = Curl_pp_sendf(data, &ftpc->pp, "MKD %s",
                                 ftpc->dirs[ftpc->cwdcount - 1]);
          if(!result)
            state(data, FTP_MKD);
        }
        else {
          /* return failure */
          failf(data, "Server denied you to change to the given directory");
          ftpc->cwdfail = TRUE; /* don't remember this path as we failed
                                   to enter it */
          result = CURLE_REMOTE_ACCESS_DENIED;
        }
      }
      else {
        /* success */
        ftpc->count2 = 0;
        if(++ftpc->cwdcount <= ftpc->dirdepth)
          /* send next CWD */
          result = Curl_pp_sendf(data, &ftpc->pp, "CWD %s",
                                 ftpc->dirs[ftpc->cwdcount - 1]);
        else
          result = ftp_state_mdtm(data);
      }
      break;

    case FTP_MKD:
      if((ftpcode/100 != 2) && !ftpc->count3--) {
        /* failure to MKD the dir */
        failf(data, "Failed to MKD dir: %03d", ftpcode);
        result = CURLE_REMOTE_ACCESS_DENIED;
      }
      else {
        state(data, FTP_CWD);
        /* send CWD */
        result = Curl_pp_sendf(data, &ftpc->pp, "CWD %s",
                               ftpc->dirs[ftpc->cwdcount - 1]);
      }
      break;

    case FTP_MDTM:
      result = ftp_state_mdtm_resp(data, ftpcode);
      break;

    case FTP_TYPE:
    case FTP_LIST_TYPE:
    case FTP_RETR_TYPE:
    case FTP_STOR_TYPE:
      result = ftp_state_type_resp(data, ftpcode, ftpc->state);
      break;

    case FTP_SIZE:
    case FTP_RETR_SIZE:
    case FTP_STOR_SIZE:
      result = ftp_state_size_resp(data, ftpcode, ftpc->state);
      break;

    case FTP_REST:
    case FTP_RETR_REST:
      result = ftp_state_rest_resp(data, conn, ftpcode, ftpc->state);
      break;

    case FTP_PRET:
      if(ftpcode != 200) {
        /* there only is this one standard OK return code. */
        failf(data, "PRET command not accepted: %03d", ftpcode);
        return CURLE_FTP_PRET_FAILED;
      }
      result = ftp_state_use_pasv(data, conn);
      break;

    case FTP_PASV:
      result = ftp_state_pasv_resp(data, ftpcode);
      break;

    case FTP_PORT:
      result = ftp_state_port_resp(data, ftpcode);
      break;

    case FTP_LIST:
    case FTP_RETR:
      result = ftp_state_get_resp(data, ftpcode, ftpc->state);
      break;

    case FTP_STOR:
      result = ftp_state_stor_resp(data, ftpcode, ftpc->state);
      break;

    case FTP_QUIT:
      /* fallthrough, just stop! */
    default:
      /* internal error */
      state(data, FTP_STOP);
      break;
    }
  } /* if(ftpcode) */

  return result;
}